

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_message_metadata_callback_set(fio_msg_metadata_fn callback,int enable)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  fio_lock_i ret;
  timespec local_28;
  
  if (callback != (fio_msg_metadata_fn)0x0) {
    LOCK();
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.meta.lock);
    if (fio_postoffice.meta.lock != '\0') {
      do {
        fio_postoffice.meta.lock = '\x01';
        local_28.tv_sec = 0;
        local_28.tv_nsec = 1;
        nanosleep(&local_28,(timespec *)0x0);
        LOCK();
        UNLOCK();
        local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.meta.lock);
      } while (fio_postoffice.meta.lock != '\0');
    }
    fio_postoffice.meta.lock = '\x01';
    uVar1 = fio_postoffice.meta.ary.end - fio_postoffice.meta.ary.start;
    uVar4 = 0xffffffffffffffff;
    if (uVar1 != 0) {
      sVar3 = fio_postoffice.meta.ary.start;
      sVar2 = fio_postoffice.meta.ary.start;
      if (fio_postoffice.meta.ary.start <= fio_postoffice.meta.ary.end && uVar1 != 0) {
        do {
          sVar3 = sVar2;
          if (fio_postoffice.meta.ary.arry[sVar3] == callback) break;
          sVar2 = sVar3 + 1;
          sVar3 = fio_postoffice.meta.ary.end;
        } while (fio_postoffice.meta.ary.end != sVar2);
      }
      uVar4 = 0xffffffffffffffff;
      if (sVar3 != fio_postoffice.meta.ary.end) {
        uVar4 = sVar3 - fio_postoffice.meta.ary.start;
      }
    }
    if (uVar4 != 0xffffffffffffffff) {
      uVar5 = uVar4;
      if ((long)uVar4 < 0) {
        uVar5 = uVar4 + uVar1;
        if ((long)(uVar4 + uVar1) < 1) {
          uVar5 = 0;
        }
      }
      if (uVar5 < uVar1) {
        if (uVar5 == 0) {
          fio_postoffice.meta.ary.start = fio_postoffice.meta.ary.start + 1;
        }
        else {
          uVar5 = uVar5 + fio_postoffice.meta.ary.start;
          fio_postoffice.meta.ary.end = fio_postoffice.meta.ary.end - 1;
          if (uVar5 <= fio_postoffice.meta.ary.end && fio_postoffice.meta.ary.end - uVar5 != 0) {
            memmove(fio_postoffice.meta.ary.arry + uVar5,fio_postoffice.meta.ary.arry + uVar5 + 1,
                    (fio_postoffice.meta.ary.end - uVar5) * 8);
          }
        }
      }
    }
    if (enable != 0) {
      if (fio_postoffice.meta.ary.capa <= fio_postoffice.meta.ary.end) {
        fio_meta_ary___require_on_top(&fio_postoffice.meta.ary,5);
      }
      if (fio_postoffice.meta.ary.start == fio_postoffice.meta.ary.end) {
        fio_postoffice.meta.ary.start = 0;
        fio_postoffice.meta.ary.end = 0;
      }
      fio_postoffice.meta.ary.arry[fio_postoffice.meta.ary.end] = callback;
      fio_postoffice.meta.ary.end = fio_postoffice.meta.ary.end + 1;
    }
    LOCK();
    fio_postoffice.meta.lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_message_metadata_callback_set(fio_msg_metadata_fn callback,
                                       int enable) {
  if (!callback)
    return;
  fio_lock(&fio_postoffice.meta.lock);
  fio_meta_ary_remove2(&fio_postoffice.meta.ary, callback, NULL);
  if (enable)
    fio_meta_ary_push(&fio_postoffice.meta.ary, callback);
  fio_unlock(&fio_postoffice.meta.lock);
}